

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

char * __thiscall
CVmImagePool::vmpbs_alloc_and_load_page
          (CVmImagePool *this,pool_ofs_t ofs,size_t param_2,size_t load_size)

{
  CVmImagePool_pg *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->page_size_;
  pCVar1 = this->page_info_[SUB168(ZEXT416(ofs) / auVar2,0) >> 0xc];
  seek_page_ofs(this,ofs);
  iVar3 = (*this->fp_->_vptr_CVmImageFile[4])
                    (this->fp_,load_size,
                     (ulong)pCVar1[SUB164(ZEXT416(ofs) / auVar2,0) & 0xfff].xor_mask,load_size);
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

const char *CVmImagePool::
   vmpbs_alloc_and_load_page(pool_ofs_t ofs, size_t /*page_size*/,
                             size_t load_size)
{
    CVmImagePool_pg *info;
    
    /* get the page information */
    info = get_page_info_ofs(ofs);
    
    /* seek to the correct location in the image file */
    seek_page_ofs(ofs);

    /* ask the underlying file to load the data */
    return fp_->alloc_and_read(load_size, info->xor_mask, load_size);
}